

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O3

bool __thiscall MinVR::VRVector3::operator==(VRVector3 *this,VRVector3 *v)

{
  if ((ABS(v->x - this->x) < 1e-08) && (ABS(v->y - this->y) < 1e-08)) {
    return ABS(v->z - this->z) < 1e-08;
  }
  return false;
}

Assistant:

bool VRVector3::operator==(const VRVector3& v) const {
  return (fabs(v.x - x) < VRMATH_EPSILON && 
    fabs(v.y - y) < VRMATH_EPSILON && 
    fabs(v.z - z) < VRMATH_EPSILON);
}